

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parse.hpp
# Opt level: O0

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* GetWords(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *__return_storage_ptr__,string *content)

{
  char c;
  bool bVar1;
  reference pcVar2;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Stack_e0;
  char itr;
  const_iterator __end1;
  const_iterator __begin1;
  string *__range1;
  anon_class_16_2_c7b4358f Add;
  string local_b0 [8];
  string currentWord;
  anon_class_8_1_ce93a50a local_88;
  anon_class_8_1_ce93a50a IsDelimiter;
  string local_78 [8];
  string delimiters;
  anon_class_8_1_50e62a03 local_58;
  anon_class_8_1_50e62a03 IsStandalone;
  allocator local_39;
  string local_38 [8];
  string standalone;
  string *content_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *words;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_38,"{}:;()[],<>",&local_39);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  local_58.standalone = (string *)local_38;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_78,"\t\n ",(allocator *)((long)&IsDelimiter.delimiters + 7));
  std::allocator<char>::~allocator((allocator<char> *)((long)&IsDelimiter.delimiters + 7));
  local_88.delimiters = (string *)local_78;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(__return_storage_ptr__);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_b0,"",(allocator *)((long)&Add.words + 7));
  std::allocator<char>::~allocator((allocator<char> *)((long)&Add.words + 7));
  __range1 = (string *)local_b0;
  Add.currentWord = (string *)__return_storage_ptr__;
  __end1._M_current = (char *)std::__cxx11::string::begin();
  _Stack_e0._M_current = (char *)std::__cxx11::string::end();
  while (bVar1 = __gnu_cxx::operator!=(&__end1,&stack0xffffffffffffff20), bVar1) {
    pcVar2 = __gnu_cxx::
             __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator*(&__end1);
    c = *pcVar2;
    bVar1 = GetWords::anon_class_8_1_50e62a03::operator()(&local_58,c);
    if (bVar1) {
      GetWords::anon_class_16_2_c7b4358f::operator()((anon_class_16_2_c7b4358f *)&__range1);
      std::__cxx11::string::operator=(local_b0,c);
      GetWords::anon_class_16_2_c7b4358f::operator()((anon_class_16_2_c7b4358f *)&__range1);
    }
    else {
      bVar1 = GetWords::anon_class_8_1_ce93a50a::operator()(&local_88,c);
      if (bVar1) {
        GetWords::anon_class_16_2_c7b4358f::operator()((anon_class_16_2_c7b4358f *)&__range1);
      }
      else {
        std::__cxx11::string::operator+=(local_b0,c);
      }
    }
    __gnu_cxx::
    __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++(&__end1);
  }
  GetWords::anon_class_16_2_c7b4358f::operator()((anon_class_16_2_c7b4358f *)&__range1);
  std::__cxx11::string::~string(local_b0);
  std::__cxx11::string::~string(local_78);
  std::__cxx11::string::~string(local_38);
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::string> GetWords(const std::string &content) {
    std::string standalone = "{}:;()[],<>";
    auto IsStandalone = [&](char c) {
        for (char itr : standalone) {
            if (itr == c) {
                return true;
            }
        }
        return false;
    };


    std::string delimiters = "\t\n ";
    auto IsDelimiter = [&](char c) {
        for (char itr : delimiters) {
            if (itr == c) {
                return true;
            }
        }
        return false;
    };

    std::vector<std::string> words;
    std::string currentWord = "";
    auto Add = [&]() {
        if (currentWord.size() == 0) {
            return;
        }
        words.push_back(currentWord);
        currentWord = "";
    };


    for (char itr : content) {
        if (IsStandalone(itr)) {
            Add();
            currentWord = itr;
            Add();
        } else if (IsDelimiter(itr)) {
            Add();
        } else {
            currentWord += itr;
        }
    }

    Add();

    return words;
}